

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

bool bssl::anon_unknown_0::CipherListsEqual
               (SSL_CTX *ctx,
               vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
               *expected)

{
  uint uVar1;
  unsigned_long uVar2;
  int iVar3;
  stack_st_SSL_CIPHER *sk;
  size_t sVar4;
  size_type sVar5;
  SSL_CIPHER *pSVar6;
  SSL_CIPHER *c;
  const_reference pvVar7;
  ulong uVar8;
  SSL_CIPHER *cipher;
  size_t i;
  stack_st_SSL_CIPHER *ciphers;
  vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
  *expected_local;
  SSL_CTX *ctx_local;
  
  sk = SSL_CTX_get_ciphers(ctx);
  sVar4 = sk_SSL_CIPHER_num(sk);
  sVar5 = std::
          vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
          ::size(expected);
  if (sVar4 == sVar5) {
    for (cipher = (SSL_CIPHER *)0x0;
        pSVar6 = (SSL_CIPHER *)
                 std::
                 vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
                 ::size(expected), cipher < pSVar6; cipher = (SSL_CIPHER *)((long)&cipher->name + 1)
        ) {
      c = (SSL_CIPHER *)sk_SSL_CIPHER_value(sk,(size_t)cipher);
      pvVar7 = std::
               vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
               ::operator[](expected,(size_type)cipher);
      uVar2 = pvVar7->id;
      uVar8 = SSL_CIPHER_get_id(c);
      if (uVar2 != (uVar8 & 0xffffffff)) {
        return false;
      }
      pvVar7 = std::
               vector<bssl::(anonymous_namespace)::ExpectedCipher,_std::allocator<bssl::(anonymous_namespace)::ExpectedCipher>_>
               ::operator[](expected,(size_type)cipher);
      uVar1 = pvVar7->in_group_flag;
      iVar3 = SSL_CTX_cipher_in_group(ctx,(size_t)cipher);
      if (uVar1 != (iVar3 != 0)) {
        return false;
      }
    }
    ctx_local._7_1_ = true;
  }
  else {
    ctx_local._7_1_ = false;
  }
  return ctx_local._7_1_;
}

Assistant:

static bool CipherListsEqual(SSL_CTX *ctx,
                             const std::vector<ExpectedCipher> &expected) {
  const STACK_OF(SSL_CIPHER) *ciphers = SSL_CTX_get_ciphers(ctx);
  if (sk_SSL_CIPHER_num(ciphers) != expected.size()) {
    return false;
  }

  for (size_t i = 0; i < expected.size(); i++) {
    const SSL_CIPHER *cipher = sk_SSL_CIPHER_value(ciphers, i);
    if (expected[i].id != SSL_CIPHER_get_id(cipher) ||
        expected[i].in_group_flag != !!SSL_CTX_cipher_in_group(ctx, i)) {
      return false;
    }
  }

  return true;
}